

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FigureTests-v5.cpp
# Opt level: O3

void __thiscall
v5::FigureTests_v5_square_clone_method_called_directly_return_pointer_of_type_Square_Test::TestBody
          (FigureTests_v5_square_clone_method_called_directly_return_pointer_of_type_Square_Test
           *this)

{
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8;
  
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FigureTests_v5, square_clone_method_called_directly_return_pointer_of_type_Square)
{
    auto square = Square{};
    auto figure = object::clone(square);

    ASSERT_TRUE((std::is_same<std::unique_ptr<Square>, decltype(figure)>::value));
}